

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Board.cpp
# Opt level: O2

void __thiscall Board::print(Board *this,string *messageToPrint)

{
  int iVar1;
  ostream *poVar2;
  int j;
  long lVar3;
  char *pcVar4;
  int i;
  long lVar5;
  
  printSeperator();
  poVar2 = std::operator<<((ostream *)&std::cout,(string *)messageToPrint);
  std::endl<char,std::char_traits<char>>(poVar2);
  for (lVar5 = 0; lVar5 != 6; lVar5 = lVar5 + 1) {
    for (lVar3 = 0; lVar3 != 6; lVar3 = lVar3 + 1) {
      iVar1 = this->cells[0][lVar3];
      if (iVar1 == 0) {
        poVar2 = (ostream *)&std::cout;
        pcVar4 = ". ";
      }
      else {
        poVar2 = std::operator<<((ostream *)&std::cout,(char)iVar1 + '@');
        pcVar4 = " ";
      }
      std::operator<<(poVar2,pcVar4);
    }
    std::endl<char,std::char_traits<char>>((ostream *)&std::cout);
    this = (Board *)(this->cells + 1);
  }
  printSeperator();
  return;
}

Assistant:

void Board::print(const string messageToPrint) {
    printSeperator();
    pp(messageToPrint);
    for (int i = 0; i < BOARD_SIZE; ++i) {
        for (int j = 0; j < BOARD_SIZE; ++j) {
            if (cells[i][j] == 0) {
                cout << ". ";
            } else {
                cout << static_cast<char>(cells[i][j] + 64) << " ";
            }
        }
        cout << endl;
    }
    printSeperator();
}